

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextVkImpl::FinishFrame(DeviceContextVkImpl *this)

{
  Uint64 CmdQueueMask;
  DeviceContextVkImpl *this_00;
  SoftwareQueueIndex SVar1;
  char (*Args) [17];
  undefined7 extraout_var;
  char (*Args_1) [64];
  char (*in_R8) [154];
  _Hash_node_base *p_Var2;
  string _msg;
  string local_60;
  Uint8 local_39;
  DeviceContextVkImpl *local_38;
  
  p_Var2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DbgMappedBuffers._M_h.
           _M_before_begin._M_nxt;
  local_38 = this;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      Args = (char (*) [17])(*(code *)(p_Var2[1]._M_nxt)->_M_nxt[4]._M_nxt)();
      if (Args[1][3] == '\x02') {
        FormatString<char[17],char_const*,char[110]>
                  (&local_60,(Diligent *)"Dynamic buffer \'",Args,
                   (char **)
                   "\' is still mapped when finishing the frame. The contents of the buffer and mapped address will become invalid"
                   ,(char (*) [110])in_R8);
        if (DebugMessageCallback != (undefined *)0x0) {
          in_R8 = (char (*) [154])0x0;
          (*(code *)DebugMessageCallback)(1,local_60._M_dataplus._M_p,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  this_00 = local_38;
  if ((local_38->m_State).NumCommands != 0) {
    if ((local_38->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == true) {
      local_39 = (local_38->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.ContextId;
      FormatString<char[60],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[154]>
                (&local_60,(Diligent *)"There are outstanding commands in deferred device context #"
                 ,(char (*) [60])&local_39,
                 (IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *)
                 " when finishing the frame. This is an error and may cause unpredicted behaviour. Close all deferred contexts and execute them before finishing the frame."
                 ,in_R8);
      if (DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char (*) [154])0x0;
        (*(code *)DebugMessageCallback)(2,local_60._M_dataplus._M_p,0,0);
      }
    }
    else {
      FormatString<char[221]>
                (&local_60,
                 (char (*) [221])
                 "There are outstanding commands in the immediate device context when finishing the frame. This is an error and may cause unpredicted behaviour. Call Flush() to submit all commands for execution before finishing the frame."
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char (*) [154])0x0;
        (*(code *)DebugMessageCallback)(2,local_60._M_dataplus._M_p,0,0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (0 < this_00->m_ActiveQueriesCounter) {
    FormatString<char[11],int,char[120]>
              (&local_60,(Diligent *)"There are ",(char (*) [11])&this_00->m_ActiveQueriesCounter,
               (int *)
               " active queries in the device context when finishing the frame. All queries must be ended before the frame is finished."
               ,(char (*) [120])in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_60._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this_00->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[46]>(&local_60,(char (*) [46])"Finishing frame inside an active render pass.")
    ;
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_60._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this_00->m_MappedTextures)._M_h._M_element_count != 0) {
    FormatString<char[153]>
              (&local_60,
               (char (*) [153])
               "There are mapped textures in the device context when finishing the frame. All dynamic resources must be used in the same frame in which they are mapped."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_60._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  CmdQueueMask = (this_00->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 m_SubmittedBuffersCmdQueueMask.super___atomic_base<unsigned_long>._M_i;
  if ((this_00->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == false) {
    SVar1 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                      (&this_00->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
    Args_1 = (char (*) [64])(CONCAT71(extraout_var,SVar1.m_Value) & 0xffffffff);
    if (CmdQueueMask != 1L << ((byte)Args_1 & 0x3f)) {
      FormatString<char[26],char[64]>
                (&local_60,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"IsDeferred() || QueueMask == (Uint64{1} << GetCommandQueueId())",
                 Args_1);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"FinishFrame",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x580);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  VulkanUploadHeap::ReleaseAllocatedPages(&this_00->m_UploadHeap,CmdQueueMask);
  VulkanDynamicHeap::ReleaseMasterBlocks
            (&this_00->m_DynamicHeap,
             (this_00->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject,CmdQueueMask)
  ;
  DynamicDescriptorSetAllocator::ReleasePools(&this_00->m_DynamicDescrSetAllocator,CmdQueueMask);
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::EndFrame
            (&this_00->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  return;
}

Assistant:

void DeviceContextVkImpl::FinishFrame()
{
#ifdef DILIGENT_DEBUG
    for (const auto& MappedBuffIt : m_DbgMappedBuffers)
    {
        const BufferDesc& BuffDesc = MappedBuffIt.first->GetDesc();
        if (BuffDesc.Usage == USAGE_DYNAMIC)
        {
            LOG_WARNING_MESSAGE("Dynamic buffer '", BuffDesc.Name, "' is still mapped when finishing the frame. The contents of the buffer and mapped address will become invalid");
        }
    }
#endif

    if (GetNumCommandsInCtx() != 0)
    {
        if (IsDeferred())
        {
            LOG_ERROR_MESSAGE("There are outstanding commands in deferred device context #", GetContextId(),
                              " when finishing the frame. This is an error and may cause unpredicted behaviour."
                              " Close all deferred contexts and execute them before finishing the frame.");
        }
        else
        {
            LOG_ERROR_MESSAGE("There are outstanding commands in the immediate device context when finishing the frame."
                              " This is an error and may cause unpredicted behaviour. Call Flush() to submit all commands"
                              " for execution before finishing the frame.");
        }
    }

    if (m_ActiveQueriesCounter > 0)
    {
        LOG_ERROR_MESSAGE("There are ", m_ActiveQueriesCounter,
                          " active queries in the device context when finishing the frame. "
                          "All queries must be ended before the frame is finished.");
    }

    if (m_pActiveRenderPass != nullptr)
    {
        LOG_ERROR_MESSAGE("Finishing frame inside an active render pass.");
    }

    if (!m_MappedTextures.empty())
    {
        LOG_ERROR_MESSAGE("There are mapped textures in the device context when finishing the frame. All dynamic resources must be used in the same frame in which they are mapped.");
    }

    const Uint64 QueueMask = GetSubmittedBuffersCmdQueueMask();
    VERIFY_EXPR(IsDeferred() || QueueMask == (Uint64{1} << GetCommandQueueId()));

    // Release resources used by the context during this frame.

    // Upload heap returns all allocated pages to the global memory manager.
    // Note: as global memory manager is hosted by the render device, the upload heap can be destroyed
    // before the pages are actually returned to the manager.
    m_UploadHeap.ReleaseAllocatedPages(QueueMask);

    // Dynamic heap returns all allocated master blocks to the global dynamic memory manager.
    // Note: as global dynamic memory manager is hosted by the render device, the dynamic heap can
    // be destroyed before the blocks are actually returned to the global dynamic memory manager.
    m_DynamicHeap.ReleaseMasterBlocks(*m_pDevice, QueueMask);

    // Dynamic descriptor set allocator returns all allocated pools to the global dynamic descriptor pool manager.
    // Note: as global pool manager is hosted by the render device, the allocator can
    // be destroyed before the pools are actually returned to the global pool manager.
    m_DynamicDescrSetAllocator.ReleasePools(QueueMask);

    EndFrame();
}